

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_RsbPrint(Gia_RsbMan_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  Vec_Int_t *vLevel [2];
  uint local_4c;
  Vec_Int_t *local_48 [3];
  
  uVar1 = p->vObjs->nSize;
  iVar3 = 1 << ((byte)uVar1 & 0x1f);
  if (p->vSets[0]->nSize != iVar3) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x553,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  if (p->vSets[1]->nSize != iVar3) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x554,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  uVar4 = Gia_RsbCost(p);
  printf("Database for %d objects and cost %d:\n",(ulong)uVar1,(ulong)uVar4);
  local_4c = 0;
  pVVar5 = p->vSets[0];
  if (0 < pVVar5->nSize) {
    do {
      if ((int)local_4c < 0) {
LAB_007bca80:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_48[0] = pVVar5->pArray + local_4c;
      if (p->vSets[1]->nSize <= (int)local_4c) goto LAB_007bca80;
      local_48[1] = p->vSets[1]->pArray + local_4c;
      uVar7 = 0;
      do {
        printf("%5d : ",(ulong)local_4c);
        Extra_PrintBinary2(_stdout,&local_4c,p->vObjs->nSize);
        printf(" %d ",uVar7 & 0xffffffff);
        pVVar2 = local_48[uVar7];
        printf("Vector has %d entries: {",(ulong)(uint)pVVar2->nSize);
        if (0 < pVVar2->nSize) {
          lVar6 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar2->pArray[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < pVVar2->nSize);
        }
        puts(" }");
        bVar8 = uVar7 == 0;
        uVar7 = uVar7 + 1;
      } while (bVar8);
      local_4c = local_4c + 1;
      pVVar5 = p->vSets[0];
    } while ((int)local_4c < pVVar5->nSize);
  }
  return;
}

Assistant:

void Gia_RsbPrint( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; 
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    printf( "Database for %d objects and cost %d:\n", Vec_IntSize(p->vObjs), Gia_RsbCost(p) );
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
    {
        for ( n = 0; n < 2; n++ )
        {
            printf( "%5d : ", i );
            Extra_PrintBinary2( stdout, (unsigned*)&i, Vec_IntSize(p->vObjs) ); printf( " %d ", n );
            Vec_IntPrint( vLevel[n] );
        }
    }    
}